

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laserDriver.h
# Opt level: O0

void publish_scan(rplidar_response_measurement_node_hq_t *nodes,LaserScan *scan_msg,
                 size_t node_count,uint32_t time_start,double scan_time,bool inverted,
                 float angle_min,float angle_max,float max_distance,uint32_t frame_id)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uStack_60;
  float read_value_1;
  size_t i_1;
  ulong uStack_50;
  float read_value;
  size_t i;
  bool reverse_data;
  bool reversed;
  uint32_t frame_id_local;
  float max_distance_local;
  float angle_max_local;
  float angle_min_local;
  bool inverted_local;
  double scan_time_local;
  uint32_t time_start_local;
  size_t node_count_local;
  LaserScan *scan_msg_local;
  rplidar_response_measurement_node_hq_t *nodes_local;
  
  if (angle_max <= angle_min) {
    scan_msg->angle_min = 3.1415927 - angle_min;
    scan_msg->angle_max = 3.1415927 - angle_max;
  }
  else {
    scan_msg->angle_min = 3.1415927 - angle_max;
    scan_msg->angle_max = 3.1415927 - angle_min;
  }
  lVar3 = node_count - 1;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  scan_msg->angle_increment =
       (float)((double)(scan_msg->angle_max - scan_msg->angle_min) /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
  scan_msg->scan_time = (float)scan_time;
  lVar3 = node_count - 1;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  scan_msg->time_increment =
       (float)(scan_time /
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)));
  scan_msg->range_min = 0.15;
  scan_msg->range_max = max_distance;
  if ((inverted) || (bVar1 = true, angle_max <= angle_min)) {
    bVar1 = inverted && angle_max <= angle_min;
  }
  if (bVar1) {
    for (uStack_60 = 0; uStack_60 < node_count; uStack_60 = uStack_60 + 1) {
      fVar4 = ((float)nodes[uStack_60].dist_mm_q2 / 4.0) / 1000.0;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        *(float *)((long)scan_msg + ((node_count - 1) - uStack_60) * 4 + 0x1c) = fVar4;
      }
      else {
        fVar4 = std::numeric_limits<float>::infinity();
        *(float *)((long)scan_msg + ((node_count - 1) - uStack_60) * 4 + 0x1c) = fVar4;
      }
      *(float *)((long)scan_msg + ((node_count - 1) - uStack_60) * 4 + 0x5bc) =
           (float)((int)(uint)nodes[uStack_60].quality >> 2);
    }
  }
  else {
    for (uStack_50 = 0; uStack_50 < node_count; uStack_50 = uStack_50 + 1) {
      fVar4 = ((float)nodes[uStack_50].dist_mm_q2 / 4.0) / 1000.0;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        scan_msg->ranges[uStack_50] = fVar4;
      }
      else {
        fVar4 = std::numeric_limits<float>::infinity();
        scan_msg->ranges[uStack_50] = fVar4;
      }
      scan_msg->intensities[uStack_50] = (float)((int)(uint)nodes[uStack_50].quality >> 2);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout," angle_max: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,scan_msg->angle_max);
  poVar2 = std::operator<<(poVar2," angle_min: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,scan_msg->angle_min);
  poVar2 = std::operator<<(poVar2," angle_increment: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,scan_msg->angle_increment);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_89e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,scan_msg->scan_time);
  poVar2 = std::operator<<(poVar2," time_increment: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,scan_msg->time_increment);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void publish_scan( rplidar_response_measurement_node_hq_t *nodes, \
		   slam::sensor::LaserScan &scan_msg,		   
		   size_t node_count, \
		   uint32_t time_start,\
		   double scan_time, bool inverted,\
		   float angle_min, float angle_max,\
		   float max_distance,\
		   uint32_t frame_id )
{
	
	//scan_msg.time_stamp = time_start;
	//scan_msg.frame_id = frame_id;
	
	bool reversed = ( angle_max > angle_min );
	if( reversed ){
		scan_msg.angle_min = M_PI - angle_max;
		scan_msg.angle_max = M_PI - angle_min;
	}	
	else{
		scan_msg.angle_min = M_PI - angle_min;
		scan_msg.angle_max = M_PI - angle_max;
	}
	
	scan_msg.angle_increment = ( scan_msg.angle_max - scan_msg.angle_min ) / (double)( node_count - 1 );
	
	scan_msg.scan_time = scan_time;
	scan_msg.time_increment = scan_time / ( double )( node_count - 1 );
	
	scan_msg.range_min = 0.15;
	scan_msg.range_max = max_distance ;//8.0

	bool reverse_data = ( !inverted && reversed ) || ( inverted && !reversed );
	if( !reverse_data ){
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[i] = std::numeric_limits<float>::infinity();
			}
			else{
				scan_msg.ranges[i] = read_value;
			}
			scan_msg.intensities[i] = ( float )( nodes[i].quality >> 2 );
		}
	}
	else{
		for( size_t i = 0; i < node_count; i ++ ){
			float read_value = ( float )nodes[i].dist_mm_q2 / 4.0f / 1000;
			if( read_value == 0 ){
				scan_msg.ranges[ node_count - 1 - i ] = std::numeric_limits<float>::infinity(); 
			}
			else{
				scan_msg.ranges[ node_count - 1 - i ] = read_value;
			}
			scan_msg.intensities[ node_count - 1 - i ] =  ( float )( nodes[i].quality >> 2 );
		}
	}

	/* 打印测试结果 */
	//std::cout << "frame_id: " << scan_msg.frame_id<<std::endl;
	//std::cout << "time_stamp: "<< scan_msg.time_stamp<<std::endl;
	std::cout << " angle_max: " << scan_msg.angle_max << " angle_min: " << scan_msg.angle_min <<" angle_increment: "<<scan_msg.angle_increment<< std::endl;
	std::cout << " scan_time：" << scan_msg.scan_time << " time_increment: " << scan_msg.time_increment << std::endl;
	/*for (size_t i = 0; i < node_count; i++){
		std::cout << "ranges[" << i << "]: " << scan_msg.ranges[i] << std::endl;
	}*/
}